

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O0

void __thiscall wasm::SourceMapReader::parse(SourceMapReader *this,Module *wasm)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ulong uVar2;
  bool bVar3;
  int32_t iVar4;
  char *pcVar5;
  MapParseException *pMVar6;
  __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var7;
  element_type *peVar8;
  Ref *pRVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  size_t sVar12;
  basic_string_view<char,_std::char_traits<char>_> local_460;
  undefined1 local_44a;
  allocator<char> local_449;
  string local_448;
  string_view local_428;
  undefined1 local_418 [8];
  Ref m;
  string local_400;
  string_view local_3e0;
  undefined1 local_3ca;
  allocator<char> local_3c9;
  string local_3c8;
  string_view local_3a8;
  undefined1 local_398 [8];
  Ref f;
  allocator<char> local_371;
  string local_370;
  string_view local_350;
  undefined1 local_340 [8];
  Ref sr;
  allocator<char> local_319;
  value_type local_318;
  undefined1 local_2f2;
  allocator<char> local_2f1;
  string local_2f0;
  undefined1 local_2d0 [8];
  Ref v_1;
  size_t i_2;
  string local_2b0;
  string_view local_290;
  undefined1 local_280 [8];
  Ref n;
  allocator<char> local_259;
  value_type local_258;
  ulong local_238;
  size_t i_1;
  string local_228;
  string_view local_208;
  undefined1 local_1f8 [8];
  Ref sc;
  allocator<char> local_1d1;
  value_type local_1d0;
  undefined1 local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  undefined1 local_188 [8];
  Ref v;
  size_t i;
  undefined1 local_160 [8];
  Ref s;
  string local_148;
  string_view local_128;
  string_view local_118;
  undefined1 local_102;
  allocator<char> local_101;
  string local_100;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8 [2];
  JsonParseException jx;
  undefined1 local_30 [8];
  Value json;
  Module *wasm_local;
  SourceMapReader *this_local;
  
  json.field_1.str.str._M_str = (char *)wasm;
  bVar3 = std::vector<char,_std::allocator<char>_>::empty(this->buffer);
  if (bVar3) {
    return;
  }
  ::json::Value::Value((Value *)local_30);
  pcVar5 = std::vector<char,_std::allocator<char>_>::data(this->buffer);
  ::json::Value::parse((Value *)local_30,pcVar5,ASCII);
  bVar3 = ::json::Value::isObject((Value *)local_30);
  if (!bVar3) {
    local_aa = 1;
    pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a8,"Source map is not valid JSON",&local_a9);
    MapParseException::MapParseException(pMVar6,local_a8);
    local_aa = 0;
    __cxa_throw(pMVar6,&MapParseException::typeinfo,MapParseException::~MapParseException);
  }
  IString::IString((IString *)&local_c0,"version");
  bVar3 = ::json::Value::has((Value *)local_30,(IString)local_c0);
  if (bVar3) {
    IString::IString((IString *)&local_d0,"version");
    p_Var7 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             ::json::Value::operator[]((Value *)local_30,(IString)local_d0);
    peVar8 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var7);
    bVar3 = ::json::Value::isNumber(peVar8);
    if (bVar3) {
      IString::IString((IString *)&local_e0,"version");
      p_Var7 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               ::json::Value::operator[]((Value *)local_30,(IString)local_e0);
      peVar8 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var7);
      iVar4 = ::json::Value::getInteger(peVar8);
      if (iVar4 == 3) {
        IString::IString((IString *)&local_118,"sources");
        bVar3 = ::json::Value::has((Value *)local_30,(IString)local_118);
        if (bVar3) {
          IString::IString((IString *)&local_128,"sources");
          p_Var7 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   ::json::Value::operator[]((Value *)local_30,(IString)local_128);
          peVar8 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var7);
          bVar3 = ::json::Value::isArray(peVar8);
          if (bVar3) {
            IString::IString((IString *)&i,"sources");
            pRVar9 = ::json::Value::operator[]((Value *)local_30,(IString)_i);
            ::json::Value::Ref::Ref((Ref *)local_160,pRVar9);
            v.super_shared_ptr<json::Value>.
            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            while( true ) {
              _Var1._M_pi = v.super_shared_ptr<json::Value>.
                            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi;
              peVar8 = std::
                       __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_160);
              p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::json::Value::size(peVar8);
              if (p_Var10 <= _Var1._M_pi) break;
              pRVar9 = ::json::Value::Ref::operator[]
                                 ((Ref *)local_160,
                                  (size_t)v.super_shared_ptr<json::Value>.
                                          super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi);
              ::json::Value::Ref::Ref((Ref *)local_188,pRVar9);
              p_Var7 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )::json::Value::Ref::operator[]
                                  ((Ref *)local_160,
                                   (size_t)v.super_shared_ptr<json::Value>.
                                           super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
              peVar8 = std::
                       __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->(p_Var7);
              bVar3 = ::json::Value::isString(peVar8);
              if (!bVar3) {
                local_1aa = 1;
                pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a8,"Source map sources contains non-string",&local_1a9)
                ;
                MapParseException::MapParseException(pMVar6,&local_1a8);
                local_1aa = 0;
                __cxa_throw(pMVar6,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(json.field_1.str.str._M_str + 0xf0);
              peVar8 = std::
                       __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_188);
              pcVar5 = ::json::Value::getCString(peVar8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d0,pcVar5,&local_1d1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(pvVar11,&local_1d0);
              std::__cxx11::string::~string((string *)&local_1d0);
              std::allocator<char>::~allocator(&local_1d1);
              ::json::Value::Ref::~Ref((Ref *)local_188);
              v.super_shared_ptr<json::Value>.
              super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(v.super_shared_ptr<json::Value>.
                            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base + 1);
            }
            IString::IString((IString *)
                             &sc.super_shared_ptr<json::Value>.
                              super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,"sourcesContent");
            bVar3 = ::json::Value::has((Value *)local_30,(IString)stack0xfffffffffffffe18);
            if (bVar3) {
              IString::IString((IString *)&local_208,"sourcesContent");
              pRVar9 = ::json::Value::operator[]((Value *)local_30,(IString)local_208);
              ::json::Value::Ref::Ref((Ref *)local_1f8,pRVar9);
              peVar8 = std::
                       __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_1f8);
              bVar3 = ::json::Value::isArray(peVar8);
              if (!bVar3) {
                i_1._6_1_ = 1;
                pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_228,"Source map sourcesContent is not an array",
                           (allocator<char> *)((long)&i_1 + 7));
                MapParseException::MapParseException(pMVar6,&local_228);
                i_1._6_1_ = 0;
                __cxa_throw(pMVar6,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              local_238 = 0;
              while( true ) {
                uVar2 = local_238;
                peVar8 = std::
                         __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_1f8);
                sVar12 = ::json::Value::size(peVar8);
                if (sVar12 <= uVar2) break;
                pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(json.field_1.str.str._M_str + 0x160);
                p_Var7 = (__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)::json::Value::Ref::operator[]((Ref *)local_1f8,local_238);
                peVar8 = std::
                         __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(p_Var7);
                pcVar5 = ::json::Value::getCString(peVar8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,pcVar5,&local_259);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(pvVar11,&local_258);
                std::__cxx11::string::~string((string *)&local_258);
                std::allocator<char>::~allocator(&local_259);
                local_238 = local_238 + 1;
              }
              ::json::Value::Ref::~Ref((Ref *)local_1f8);
            }
            IString::IString((IString *)
                             &n.super_shared_ptr<json::Value>.
                              super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,"names");
            bVar3 = ::json::Value::has((Value *)local_30,(IString)stack0xfffffffffffffd90);
            if (bVar3) {
              IString::IString((IString *)&local_290,"names");
              pRVar9 = ::json::Value::operator[]((Value *)local_30,(IString)local_290);
              ::json::Value::Ref::Ref((Ref *)local_280,pRVar9);
              peVar8 = std::
                       __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_280);
              bVar3 = ::json::Value::isArray(peVar8);
              if (!bVar3) {
                i_2._6_1_ = 1;
                pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2b0,"Source map names is not an array",
                           (allocator<char> *)((long)&i_2 + 7));
                MapParseException::MapParseException(pMVar6,&local_2b0);
                i_2._6_1_ = 0;
                __cxa_throw(pMVar6,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              v_1.super_shared_ptr<json::Value>.
              super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              while( true ) {
                _Var1._M_pi = v_1.super_shared_ptr<json::Value>.
                              super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                peVar8 = std::
                         __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_280);
                p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ::json::Value::size(peVar8);
                if (p_Var10 <= _Var1._M_pi) break;
                pRVar9 = ::json::Value::Ref::operator[]
                                   ((Ref *)local_280,
                                    (size_t)v_1.super_shared_ptr<json::Value>.
                                            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi);
                ::json::Value::Ref::Ref((Ref *)local_2d0,pRVar9);
                peVar8 = std::
                         __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_2d0);
                bVar3 = ::json::Value::isString(peVar8);
                if (!bVar3) {
                  local_2f2 = 1;
                  pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2f0,"Source map names contains non-string",&local_2f1)
                  ;
                  MapParseException::MapParseException(pMVar6,&local_2f0);
                  local_2f2 = 0;
                  __cxa_throw(pMVar6,&MapParseException::typeinfo,
                              MapParseException::~MapParseException);
                }
                pvVar11 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(json.field_1.str.str._M_str + 0x108);
                peVar8 = std::
                         __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_2d0);
                pcVar5 = ::json::Value::getCString(peVar8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_318,pcVar5,&local_319);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(pvVar11,&local_318);
                std::__cxx11::string::~string((string *)&local_318);
                std::allocator<char>::~allocator(&local_319);
                ::json::Value::Ref::~Ref((Ref *)local_2d0);
                v_1.super_shared_ptr<json::Value>.
                super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(v_1.super_shared_ptr<json::Value>.
                              super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
              }
              ::json::Value::Ref::~Ref((Ref *)local_280);
            }
            IString::IString((IString *)
                             &sr.super_shared_ptr<json::Value>.
                              super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,"sourceRoot");
            bVar3 = ::json::Value::has((Value *)local_30,(IString)stack0xfffffffffffffcd0);
            if (bVar3) {
              IString::IString((IString *)&local_350,"sourceRoot");
              pRVar9 = ::json::Value::operator[]((Value *)local_30,(IString)local_350);
              ::json::Value::Ref::Ref((Ref *)local_340,pRVar9);
              peVar8 = std::
                       __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_340);
              bVar3 = ::json::Value::isString(peVar8);
              if (!bVar3) {
                pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_370,"Source map sourceRoot is not a string",&local_371);
                MapParseException::MapParseException(pMVar6,&local_370);
                __cxa_throw(pMVar6,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              peVar8 = std::
                       __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_340);
              pcVar5 = ::json::Value::getCString(peVar8);
              std::__cxx11::string::operator=
                        ((string *)(json.field_1.str.str._M_str + 0x120),pcVar5);
              ::json::Value::Ref::~Ref((Ref *)local_340);
            }
            IString::IString((IString *)
                             &f.super_shared_ptr<json::Value>.
                              super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,"file");
            bVar3 = ::json::Value::has((Value *)local_30,(IString)stack0xfffffffffffffc78);
            if (bVar3) {
              IString::IString((IString *)&local_3a8,"file");
              pRVar9 = ::json::Value::operator[]((Value *)local_30,(IString)local_3a8);
              ::json::Value::Ref::Ref((Ref *)local_398,pRVar9);
              peVar8 = std::
                       __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_398);
              bVar3 = ::json::Value::isString(peVar8);
              if (!bVar3) {
                local_3ca = 1;
                pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3c8,"Source map file is not a string",&local_3c9);
                MapParseException::MapParseException(pMVar6,&local_3c8);
                local_3ca = 0;
                __cxa_throw(pMVar6,&MapParseException::typeinfo,
                            MapParseException::~MapParseException);
              }
              peVar8 = std::
                       __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_398);
              pcVar5 = ::json::Value::getCString(peVar8);
              std::__cxx11::string::operator=
                        ((string *)(json.field_1.str.str._M_str + 0x140),pcVar5);
              ::json::Value::Ref::~Ref((Ref *)local_398);
            }
            IString::IString((IString *)&local_3e0,"mappings");
            bVar3 = ::json::Value::has((Value *)local_30,(IString)local_3e0);
            if (bVar3) {
              IString::IString((IString *)&local_428,"mappings");
              pRVar9 = ::json::Value::operator[]((Value *)local_30,(IString)local_428);
              ::json::Value::Ref::Ref((Ref *)local_418,pRVar9);
              peVar8 = std::
                       __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_418);
              bVar3 = ::json::Value::isString(peVar8);
              if (bVar3) {
                peVar8 = std::
                         __shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_418);
                pcVar5 = ::json::Value::getCString(peVar8);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_460,pcVar5);
                (this->mappings)._M_len = local_460._M_len;
                (this->mappings)._M_str = local_460._M_str;
                bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                  (&this->mappings);
                if (bVar3) {
                  this->location = 0;
                }
                else {
                  iVar4 = readBase64VLQ(this);
                  this->location = (long)iVar4;
                }
                ::json::Value::Ref::~Ref((Ref *)local_418);
                ::json::Value::Ref::~Ref((Ref *)local_160);
                ::json::Value::~Value((Value *)local_30);
                return;
              }
              local_44a = 1;
              pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_448,"Source map mappings is not a string",&local_449);
              MapParseException::MapParseException(pMVar6,&local_448);
              local_44a = 0;
              __cxa_throw(pMVar6,&MapParseException::typeinfo,MapParseException::~MapParseException)
              ;
            }
            m.super_shared_ptr<json::Value>.
            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
            pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_400,"Source map mappings missing",
                       (allocator<char> *)
                       ((long)&m.super_shared_ptr<json::Value>.
                               super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7));
            MapParseException::MapParseException(pMVar6,&local_400);
            m.super_shared_ptr<json::Value>.
            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
            __cxa_throw(pMVar6,&MapParseException::typeinfo,MapParseException::~MapParseException);
          }
        }
        s.super_shared_ptr<json::Value>.super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._6_1_ = 1;
        pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"Source map sources missing or not an array",
                   (allocator<char> *)
                   ((long)&s.super_shared_ptr<json::Value>.
                           super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        MapParseException::MapParseException(pMVar6,&local_148);
        s.super_shared_ptr<json::Value>.super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._6_1_ = 0;
        __cxa_throw(pMVar6,&MapParseException::typeinfo,MapParseException::~MapParseException);
      }
    }
  }
  local_102 = 1;
  pMVar6 = (MapParseException *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Source map version missing or is not 3",&local_101);
  MapParseException::MapParseException(pMVar6,&local_100);
  local_102 = 0;
  __cxa_throw(pMVar6,&MapParseException::typeinfo,MapParseException::~MapParseException);
}

Assistant:

void SourceMapReader::parse(Module& wasm) {
  if (buffer.empty()) {
    return;
  }
  json::Value json;
  try {
    json.parse(buffer.data(), json::Value::ASCII);
  } catch (json::JsonParseException jx) {
    throw MapParseException(jx);
  }
  if (!json.isObject()) {
    throw MapParseException("Source map is not valid JSON");
  }
  if (!(json.has("version") && json["version"]->isNumber() &&
        json["version"]->getInteger() == 3)) {
    throw MapParseException("Source map version missing or is not 3");
  }
  if (!(json.has("sources") && json["sources"]->isArray())) {
    throw MapParseException("Source map sources missing or not an array");
  }
  json::Ref s = json["sources"];
  for (size_t i = 0; i < s->size(); i++) {
    json::Ref v = s[i];
    if (!(s[i]->isString())) {
      throw MapParseException("Source map sources contains non-string");
    }
    wasm.debugInfoFileNames.push_back(v->getCString());
  }

  if (json.has("sourcesContent")) {
    json::Ref sc = json["sourcesContent"];
    if (!sc->isArray()) {
      throw MapParseException("Source map sourcesContent is not an array");
    }
    for (size_t i = 0; i < sc->size(); i++) {
      wasm.debugInfoSourcesContent.push_back(sc[i]->getCString());
    }
  }

  if (json.has("names")) {
    json::Ref n = json["names"];
    if (!n->isArray()) {
      throw MapParseException("Source map names is not an array");
    }
    for (size_t i = 0; i < n->size(); i++) {
      json::Ref v = n[i];
      if (!v->isString()) {
        throw MapParseException("Source map names contains non-string");
      }
      wasm.debugInfoSymbolNames.push_back(v->getCString());
    }
  }

  if (json.has("sourceRoot")) {
    json::Ref sr = json["sourceRoot"];
    if (!sr->isString()) {
      throw MapParseException("Source map sourceRoot is not a string");
    }
    wasm.debugInfoSourceRoot = sr->getCString();
  }

  if (json.has("file")) {
    json::Ref f = json["file"];
    if (!f->isString()) {
      throw MapParseException("Source map file is not a string");
    }
    wasm.debugInfoFile = f->getCString();
  }

  if (!json.has("mappings")) {
    throw MapParseException("Source map mappings missing");
  }
  json::Ref m = json["mappings"];
  if (!m->isString()) {
    throw MapParseException("Source map mappings is not a string");
  }

  mappings = m->getCString();
  if (mappings.empty()) {
    // There are no mappings.
    location = 0;
    return;
  }

  // Read the location of the first debug location.
  location = readBase64VLQ();
}